

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O3

QDate __thiscall QDate::addYears(QDate *this,int nyears)

{
  int iVar1;
  int iVar2;
  _Storage<long_long,_true> _Var3;
  int iVar4;
  optional<long_long> oVar5;
  YearMonthDay YVar6;
  
  _Var3._M_value = -0x8000000000000000;
  if (0xfffffe92c1eb868b < this->jd - 0xb69f248055U) {
    YVar6 = QGregorianCalendar::partsFromJulian(this->jd);
    if ((YVar6._0_8_ & 0xffffffff00000000) != 0x8000000000000000) {
      iVar1 = YVar6.year + nyears;
      iVar2 = (uint)(0 < nyears) * 2 + -1;
      iVar4 = 0;
      if (iVar1 < 1 == 0 < YVar6.year) {
        iVar4 = iVar2;
      }
      if (iVar1 == 0) {
        iVar4 = iVar2;
      }
      iVar4 = iVar4 + iVar1;
      if (iVar4 != 0) {
        iVar2 = QGregorianCalendar::monthLength(YVar6.month,iVar4);
        iVar1 = YVar6.day;
        if (iVar2 < YVar6.day) {
          iVar1 = iVar2;
        }
        oVar5 = QGregorianCalendar::julianFromParts(iVar4,YVar6.month,iVar1);
        if ((((undefined1  [16])
              oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
              super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) &&
           (0xfffffe92c1eb868b <
            oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
            super__Optional_payload_base<long_long>._M_payload - 0xb69f248055U)) {
          _Var3._M_value =
               oVar5.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long>._M_payload;
        }
      }
    }
  }
  return (QDate)_Var3._M_value;
}

Assistant:

QDate QDate::addYears(int nyears) const
{
    if (isNull())
        return QDate();

    auto parts = QGregorianCalendar::partsFromJulian(jd);
    if (!parts.isValid())
        return QDate();

    int old_y = parts.year;
    parts.year += nyears;

    // If we just crossed (or hit) a missing year zero, adjust year by ±1:
    if ((old_y > 0) != (parts.year > 0) || !parts.year)
        parts.year += nyears > 0 ? +1 : -1;

    return fixedDate(parts);
}